

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

GLFWbool waitForAnyEvent(double *timeout)

{
  int iVar1;
  GLFWbool GVar2;
  uint local_3c;
  int local_38;
  int i;
  pollfd fds [3];
  double *timeout_local;
  
  local_38 = *(int *)(_glfw.x11.display + 0x10);
  i._0_2_ = 1;
  i._2_2_ = 0;
  fds[0].fd = _glfw.x11.emptyEventPipe[0];
  fds[0].events = 1;
  fds[0].revents = 0;
  fds[1].fd = -1;
  fds[1].events = 1;
  fds[1].revents = 0;
  if (_glfw.joysticksInitialized != 0) {
    fds[1].fd = _glfw.linjs.inotify;
  }
  while( true ) {
    iVar1 = (*_glfw.x11.xlib.Pending)(_glfw.x11.display);
    if (iVar1 != 0) {
      return 1;
    }
    GVar2 = _glfwPollPOSIX((pollfd *)&stack0xffffffffffffffc8,3,timeout);
    if (GVar2 == 0) break;
    for (local_3c = 1; local_3c < 3; local_3c = local_3c + 1) {
      if ((fds[(long)(int)local_3c + -1].revents & 1U) != 0) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

static GLFWbool waitForAnyEvent(double* timeout)
{
    enum { XLIB_FD, PIPE_FD, INOTIFY_FD };
    struct pollfd fds[] =
    {
        [XLIB_FD] = { ConnectionNumber(_glfw.x11.display), POLLIN },
        [PIPE_FD] = { _glfw.x11.emptyEventPipe[0], POLLIN },
        [INOTIFY_FD] = { -1, POLLIN }
    };

#if defined(GLFW_BUILD_LINUX_JOYSTICK)
    if (_glfw.joysticksInitialized)
        fds[INOTIFY_FD].fd = _glfw.linjs.inotify;
#endif

    while (!XPending(_glfw.x11.display))
    {
        if (!_glfwPollPOSIX(fds, sizeof(fds) / sizeof(fds[0]), timeout))
            return GLFW_FALSE;

        for (int i = 1; i < sizeof(fds) / sizeof(fds[0]); i++)
        {
            if (fds[i].revents & POLLIN)
                return GLFW_TRUE;
        }
    }

    return GLFW_TRUE;
}